

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modkey.c
# Opt level: O1

int ffmkye(fitsfile *fptr,char *keyname,float value,int decim,char *comm,int *status)

{
  int iVar1;
  char *comm_00;
  char valstring [71];
  char oldcomm [73];
  char card [81];
  char local_128 [80];
  char local_d8 [80];
  char local_88 [88];
  
  if (0 < *status) {
    return *status;
  }
  iVar1 = ffgkey(fptr,keyname,local_128,local_d8,status);
  if (iVar1 < 1) {
    ffr2e(value,decim,local_128,status);
    comm_00 = local_d8;
    if ((comm != (char *)0x0) && (comm_00 = local_d8, *comm != '&')) {
      comm_00 = comm;
    }
    ffmkky(keyname,local_128,comm_00,local_88,status);
    ffmkey(fptr,local_88,status);
  }
  return *status;
}

Assistant:

int ffmkye(fitsfile *fptr,          /* I - FITS file pointer  */
           const char *keyname,     /* I - keyword name       */
           float value,             /* I - keyword value      */
           int decim,               /* I - no of decimals     */
           const char *comm,        /* I - keyword comment    */
           int *status)             /* IO - error status      */
{
    char valstring[FLEN_VALUE];
    char oldcomm[FLEN_COMMENT];
    char card[FLEN_CARD];

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (ffgkey(fptr, keyname, valstring, oldcomm, status) > 0)
        return(*status);                               /* get old comment */

    ffr2e(value, decim, valstring, status);   /* convert value to a string */

    if (!comm || comm[0] == '&')  /* preserve the current comment string */
        ffmkky(keyname, valstring, oldcomm, card, status);
    else
        ffmkky(keyname, valstring, comm, card, status);

    ffmkey(fptr, card, status);

    return(*status);
}